

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::Write3dmLayerComponent(ON_BinaryArchive *this,ON_ModelComponent *model_component)

{
  bool bVar1;
  ON_Layer *layer;
  
  layer = ON_Layer::Cast(&model_component->super_ON_Object);
  if (layer != (ON_Layer *)0x0) {
    bVar1 = Write3dmLayer(this,layer);
    return bVar1;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,0x2762,"","model_component parameter is not a layer component.");
  return false;
}

Assistant:

bool ON_BinaryArchive::Write3dmLayerComponent( 
  const ON_ModelComponent* model_component 
  )
{
  bool rc = false;
  for (;;)
  {
    const ON_Layer* layer = ON_Layer::Cast(model_component);
    if (nullptr == layer)
    {
      ON_ERROR("model_component parameter is not a layer component.");
      break;
    }
    rc = Write3dmLayer(*layer);
    break;
  }
  return rc;
}